

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O0

Pattern * __thiscall
trieste::detail::Pattern::operator*(Pattern *__return_storage_ptr__,Pattern *this,Pattern *rhs)

{
  element_type *peVar1;
  FastPattern local_c8;
  shared_ptr<trieste::detail::PatternDef> local_60 [2];
  shared_ptr<trieste::detail::PatternDef> local_40;
  undefined1 local_30 [8];
  PatternPtr result;
  Pattern *rhs_local;
  Pattern *this_local;
  
  result.super___shared_ptr<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)rhs;
  peVar1 = std::
           __shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  (*peVar1->_vptr_PatternDef[5])();
  peVar1 = std::
           __shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<trieste::detail::PatternDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  std::shared_ptr<trieste::detail::PatternDef>::shared_ptr(&local_40,&rhs->pattern);
  PatternDef::set_continuation(peVar1,&local_40);
  std::shared_ptr<trieste::detail::PatternDef>::~shared_ptr(&local_40);
  std::shared_ptr<trieste::detail::PatternDef>::shared_ptr
            (local_60,(shared_ptr<trieste::detail::PatternDef> *)local_30);
  FastPattern::match_seq(&local_c8,&this->fast_pattern,&rhs->fast_pattern);
  Pattern(__return_storage_ptr__,local_60,&local_c8);
  FastPattern::~FastPattern(&local_c8);
  std::shared_ptr<trieste::detail::PatternDef>::~shared_ptr(local_60);
  std::shared_ptr<trieste::detail::PatternDef>::~shared_ptr
            ((shared_ptr<trieste::detail::PatternDef> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

Pattern operator*(Pattern rhs) const
      {
        auto result = pattern->clone();
        result->set_continuation(rhs.pattern);
        return {result, FastPattern::match_seq(fast_pattern, rhs.fast_pattern)};
      }